

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-pool.c
# Opt level: O1

MMDB_entry_data_list_s * data_pool_to_list(MMDB_data_pool_s *pool)

{
  ulong uVar1;
  MMDB_entry_data_list_s *pMVar2;
  size_t sVar3;
  MMDB_entry_data_list_s *pMVar4;
  size_t sVar5;
  size_t i;
  ulong uVar6;
  size_t *psVar7;
  
  if ((pool != (MMDB_data_pool_s *)0x0) && ((uVar1 = pool->index, uVar1 != 0 || (pool->used != 0))))
  {
    uVar6 = 0;
    do {
      psVar7 = pool->sizes + uVar6;
      if (uVar6 == uVar1) {
        psVar7 = &pool->used;
      }
      pMVar2 = pool->blocks[uVar6];
      sVar3 = *psVar7;
      pMVar4 = pMVar2;
      sVar5 = sVar3;
      while (sVar5 = sVar5 - 1, sVar5 != 0) {
        pMVar4->next = pMVar4 + 1;
        pMVar4 = pMVar4 + 1;
      }
      if (uVar6 < uVar1) {
        pMVar2[sVar3 - 1].next = pool->blocks[uVar6 + 1];
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 <= uVar1);
    return pool->blocks[0];
  }
  return (MMDB_entry_data_list_s *)0x0;
}

Assistant:

MMDB_entry_data_list_s *data_pool_to_list(MMDB_data_pool_s *const pool) {
    if (!pool) {
        return NULL;
    }

    if (pool->index == 0 && pool->used == 0) {
        return NULL;
    }

    for (size_t i = 0; i <= pool->index; i++) {
        MMDB_entry_data_list_s *const block = pool->blocks[i];

        size_t size = pool->sizes[i];
        if (i == pool->index) {
            size = pool->used;
        }

        for (size_t j = 0; j < size - 1; j++) {
            MMDB_entry_data_list_s *const cur = block + j;
            cur->next = block + j + 1;
        }

        if (i < pool->index) {
            MMDB_entry_data_list_s *const last = block + size - 1;
            last->next = pool->blocks[i + 1];
        }
    }

    return pool->blocks[0];
}